

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCModule.c
# Opt level: O0

cs_err PPC_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  PPC_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = PPC_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = PPC_getInstruction;
  *(code **)(in_RDI + 0x48) = PPC_post_printer;
  *(code **)(in_RDI + 0x28) = PPC_reg_name;
  *(code **)(in_RDI + 0x40) = PPC_get_insn_id;
  *(code **)(in_RDI + 0x30) = PPC_insn_name;
  *(code **)(in_RDI + 0x38) = PPC_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err PPC_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = (MCRegisterInfo *) cs_mem_malloc(sizeof(*mri));

	PPC_init(mri);
	ud->printer = PPC_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = PPC_getInstruction;
	ud->post_printer = PPC_post_printer;

	ud->reg_name = PPC_reg_name;
	ud->insn_id = PPC_get_insn_id;
	ud->insn_name = PPC_insn_name;
	ud->group_name = PPC_group_name;

	return CS_ERR_OK;
}